

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O2

uint32_t __thiscall
asmjit::v1_14::RALocalAllocator::decideOnAssignment
          (RALocalAllocator *this,RegGroup group,uint32_t workId,uint32_t physId,
          RegMask allocableRegs)

{
  RAWorkReg RVar1;
  uint32_t homeId;
  uint32_t uVar2;
  RAWorkReg **ppRVar3;
  uint allocableRegs_00;
  
  if (allocableRegs == 0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/ralocal.cpp"
               ,0x467,"allocableRegs != 0");
  }
  ppRVar3 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                      (&this->_pass->_workRegs,(ulong)workId);
  RVar1 = (*ppRVar3)[0x4a];
  if (((byte)RVar1 != 0xff) && ((allocableRegs >> ((byte)RVar1 & 0x1f) & 1) != 0)) {
    return (uint32_t)(byte)RVar1;
  }
  allocableRegs_00 = *(uint *)(*ppRVar3 + 0x3c) & allocableRegs;
  if (allocableRegs_00 == 0) {
    allocableRegs_00 = allocableRegs;
  }
  uVar2 = pickBestSuitableRegister(this,group,allocableRegs_00);
  return uVar2;
}

Assistant:

uint32_t RALocalAllocator::decideOnAssignment(RegGroup group, uint32_t workId, uint32_t physId, RegMask allocableRegs) const noexcept {
  ASMJIT_ASSERT(allocableRegs != 0);
  DebugUtils::unused(group, physId);

  RAWorkReg* workReg = workRegById(workId);

  // Prefer home register id, if possible.
  if (workReg->hasHomeRegId()) {
    uint32_t homeId = workReg->homeRegId();
    if (Support::bitTest(allocableRegs, homeId)) {
      return homeId;
    }
  }

  // Prefer registers used upon block entries.
  RegMask previouslyAssignedRegs = workReg->allocatedMask();
  if (allocableRegs & previouslyAssignedRegs) {
    allocableRegs &= previouslyAssignedRegs;
  }

  return pickBestSuitableRegister(group, allocableRegs);
}